

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O0

void __thiscall remote::Handle::ParseMaps(Handle *this)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  string local_7f8 [32];
  long local_7d8;
  size_t fileNameSplit;
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  long local_750;
  stringstream ss;
  ostream local_740 [376];
  long local_5c8;
  size_t deviceSplit;
  size_t memorySplit;
  MapModuleMemoryRegion region;
  string local_520 [32];
  long local_500;
  size_t begin;
  ulong local_4d8;
  size_t i;
  size_t ls;
  string pathname;
  string local_4a8 [8];
  string inode;
  string local_488 [8];
  string device;
  string local_468 [8];
  string offset;
  string local_448 [8];
  string permissions;
  string local_428 [8];
  string memorySpace;
  istringstream local_408 [8];
  istringstream iss;
  string local_288 [8];
  string line;
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  istream local_218 [8];
  ifstream maps;
  Handle *this_local;
  
  std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::clear
            (&this->regions);
  std::operator+((char *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/proc/");
  std::operator+(local_238,(char *)local_258);
  std::ifstream::ifstream(local_218,local_238,8);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::string(local_288);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_288);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::istringstream::istringstream(local_408,local_288,8);
    std::__cxx11::string::string(local_428);
    std::__cxx11::string::string(local_448);
    std::__cxx11::string::string(local_468);
    std::__cxx11::string::string(local_488);
    std::__cxx11::string::string(local_4a8);
    piVar3 = std::operator>>((istream *)local_408,local_428);
    piVar3 = std::operator>>(piVar3,local_448);
    piVar3 = std::operator>>(piVar3,local_468);
    piVar3 = std::operator>>(piVar3,local_488);
    piVar3 = std::operator>>(piVar3,local_4a8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (bVar1) {
      std::__cxx11::string::string((string *)&ls);
      i = 0;
      for (local_4d8 = 0; uVar8 = local_4d8, uVar4 = std::__cxx11::string::length(), uVar8 < uVar4;
          local_4d8 = local_4d8 + 1) {
        std::__cxx11::string::substr((ulong)&begin,(ulong)local_288);
        iVar2 = std::__cxx11::string::compare((char *)&begin);
        std::__cxx11::string::~string((string *)&begin);
        if ((iVar2 == 0) && (i = i + 1, i == 5)) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_520,(ulong)local_288);
          lVar5 = std::__cxx11::string::find_first_not_of((char)local_520,0x20);
          std::__cxx11::string::~string(local_520);
          local_500 = lVar5;
          if (lVar5 == -1) {
            std::__cxx11::string::clear();
          }
          else {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)&region.client_start,(ulong)local_288);
            std::__cxx11::string::operator=((string *)&ls,(string *)&region.client_start);
            std::__cxx11::string::~string((string *)&region.client_start);
          }
        }
      }
      MapModuleMemoryRegion::MapModuleMemoryRegion((MapModuleMemoryRegion *)&memorySplit);
      deviceSplit = std::__cxx11::string::find_first_of((char)local_428,0x2d);
      local_5c8 = std::__cxx11::string::find_first_of((char)local_488,0x3a);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_750);
      if (deviceSplit != 0xffffffffffffffff) {
        poVar6 = (ostream *)std::ostream::operator<<(local_740,std::hex);
        std::__cxx11::string::substr((ulong)local_770,(ulong)local_428);
        std::operator<<(poVar6,local_770);
        std::__cxx11::string::~string(local_770);
        std::istream::operator>>((istream *)&local_750,&memorySplit);
        std::ios::clear((long)&local_750 + *(long *)(local_750 + -0x18),0);
        poVar6 = (ostream *)std::ostream::operator<<(local_740,std::hex);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_790,(ulong)local_428);
        std::operator<<(poVar6,local_790);
        std::__cxx11::string::~string(local_790);
        std::istream::operator>>((istream *)&local_750,&region.start);
        std::ios::clear((long)&local_750 + *(long *)(local_750 + -0x18),0);
      }
      if (local_5c8 != -1) {
        poVar6 = (ostream *)std::ostream::operator<<(local_740,std::hex);
        std::__cxx11::string::substr((ulong)local_7b0,(ulong)local_488);
        std::operator<<(poVar6,local_7b0);
        std::__cxx11::string::~string(local_7b0);
        std::operator>>((istream *)&local_750,(uchar *)&region.offset);
        std::ios::clear((long)&local_750 + *(long *)(local_750 + -0x18),0);
        poVar6 = (ostream *)std::ostream::operator<<(local_740,std::hex);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&fileNameSplit,(ulong)local_488);
        std::operator<<(poVar6,(string *)&fileNameSplit);
        std::__cxx11::string::~string((string *)&fileNameSplit);
        std::operator>>((istream *)&local_750,(uchar *)((long)&region.offset + 1));
        std::ios::clear((long)&local_750 + *(long *)(local_750 + -0x18),0);
      }
      poVar6 = (ostream *)std::ostream::operator<<(local_740,std::hex);
      std::operator<<(poVar6,local_468);
      std::istream::operator>>((istream *)&local_750,(ulong *)&region.readable);
      std::ios::clear((long)&local_750 + *(long *)(local_750 + -0x18),0);
      std::operator<<(local_740,local_4a8);
      std::istream::operator>>((istream *)&local_750,(ulong *)&region.deviceMajor);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_448);
      region.end._0_1_ = *pcVar7 == 'r';
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_448);
      region.end._1_1_ = *pcVar7 == 'w';
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_448);
      region.end._2_1_ = *pcVar7 == 'x';
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_448);
      region.end._3_1_ = *pcVar7 != '-';
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&region.inodeFileNumber,(string *)&ls);
        local_7d8 = std::__cxx11::string::find_last_of((char)&ls,0x2f);
        if (local_7d8 != -1) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_7f8,(ulong)&ls);
          std::__cxx11::string::operator=((string *)&region.field_0x48,local_7f8);
          std::__cxx11::string::~string(local_7f8);
        }
      }
      std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
      push_back(&this->regions,(value_type *)&memorySplit);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_750);
      MapModuleMemoryRegion::~MapModuleMemoryRegion((MapModuleMemoryRegion *)&memorySplit);
      std::__cxx11::string::~string((string *)&ls);
    }
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::istringstream::~istringstream(local_408);
  }
  std::__cxx11::string::~string(local_288);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void Handle::ParseMaps() {
        regions.clear();

        std::ifstream maps("/proc/" + pidStr + "/maps");

        std::string line;
        while (std::getline(maps, line)) {
            std::istringstream iss(line);
            std::string memorySpace, permissions, offset, device, inode;
            if (iss >> memorySpace >> permissions >> offset >> device >> inode) {
                std::string pathname;

                for(size_t ls = 0, i = 0; i < line.length(); i++) {
                    if(line.substr(i, 1).compare(" ") == 0) {
                        ls++;

                        if(ls == 5) {
                            size_t begin = line.substr(i, line.size()).find_first_not_of(' ');

                            if(begin != -1) {
                                pathname = line.substr(begin + i, line.size());
                            } else {
                                pathname.clear();
                            }
                        }
                    }
                }

                MapModuleMemoryRegion region;

                size_t memorySplit = memorySpace.find_first_of('-');
                size_t deviceSplit = device.find_first_of(':');

                std::stringstream ss;

                if(memorySplit != -1) {
                    ss << std::hex << memorySpace.substr(0, memorySplit);
                    ss >> region.start;
                    ss.clear();
                    ss << std::hex << memorySpace.substr(memorySplit + 1, memorySpace.size());
                    ss >> region.end;
                    ss.clear();
                }

                if(deviceSplit != -1) {
                    ss << std::hex << device.substr(0, deviceSplit);
                    ss >> region.deviceMajor;
                    ss.clear();
                    ss << std::hex << device.substr(deviceSplit + 1, device.size());
                    ss >> region.deviceMinor;
                    ss.clear();
                }

                ss << std::hex << offset;
                ss >> region.offset;
                ss.clear();
                ss << inode;
                ss >> region.inodeFileNumber;

                region.readable = (permissions[0] == 'r');
                region.writable = (permissions[1] == 'w');
                region.executable = (permissions[2] == 'x');
                region.shared = (permissions[3] != '-');

                if(!pathname.empty()) {
                    region.pathname = pathname;

                    size_t fileNameSplit = pathname.find_last_of('/');

                    if(fileNameSplit != -1) {
                        region.filename = pathname.substr(fileNameSplit + 1, pathname.size());
                    }
                }

                regions.push_back(region);
            }
        }
    }